

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManCreateRefsSpecial(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_44;
  Gia_Obj_t *pGStack_40;
  int i;
  Gia_Obj_t *pObjD1;
  Gia_Obj_t *pObjD0;
  Gia_Obj_t *pObjC;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  pObj = (Gia_Obj_t *)p;
  if (p->pRefs != (int *)0x0) {
    __assert_fail("p->pRefs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x155,"void Emb_ManCreateRefsSpecial(Gia_Man_t *)");
  }
  Gia_ManCleanMark0(p);
  Gia_ManCreateRefs((Gia_Man_t *)pObj);
  local_44 = 0;
  while( true ) {
    bVar5 = false;
    if (local_44 < *(int *)(pObj + 2)) {
      pFan0 = Gia_ManObj((Gia_Man_t *)pObj,local_44);
      bVar5 = pFan0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar2 = Gia_ObjIsAnd(pFan0);
    if (iVar2 != 0) {
      if ((*(ulong *)pFan0 >> 0x1e & 1) != 0) {
        __assert_fail("pObj->fMark0 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                      ,0x15a,"void Emb_ManCreateRefsSpecial(Gia_Man_t *)");
      }
      pFan1 = Gia_ObjFanin0(pFan0);
      pObjC = Gia_ObjFanin1(pFan0);
      iVar2 = Gia_ObjIsCi(pFan1);
      if ((((iVar2 == 0) && ((*(ulong *)pFan1 >> 0x1e & 1) == 0)) &&
          (iVar2 = Gia_ObjIsCi(pObjC), iVar2 == 0)) &&
         (((*(ulong *)pObjC >> 0x1e & 1) == 0 && (iVar2 = Gia_ObjIsMuxType(pFan0), iVar2 != 0)))) {
        *(ulong *)pFan0 = *(ulong *)pFan0 & 0xffffffffbfffffff | 0x40000000;
        *(ulong *)pFan1 = *(ulong *)pFan1 & 0xffffffffbfffffff | 0x40000000;
        *(ulong *)pObjC = *(ulong *)pObjC & 0xffffffffbfffffff | 0x40000000;
        pObjD0 = Gia_ObjRecognizeMux(pFan0,&stack0xffffffffffffffc0,&pObjD1);
        pGVar1 = pObj;
        pGVar3 = Gia_Regular(pObjD0);
        Gia_ObjRefDec((Gia_Man_t *)pGVar1,pGVar3);
        pGVar3 = Gia_Regular(pObjD1);
        pGVar4 = Gia_Regular(pGStack_40);
        pGVar1 = pObj;
        if (pGVar3 == pGVar4) {
          pGVar3 = Gia_Regular(pObjD1);
          Gia_ObjRefDec((Gia_Man_t *)pGVar1,pGVar3);
        }
      }
    }
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    bVar5 = false;
    if (local_44 < *(int *)(pObj + 2)) {
      pFan0 = Gia_ManObj((Gia_Man_t *)pObj,local_44);
      bVar5 = pFan0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar2 = Gia_ObjIsAnd(pFan0);
    if ((iVar2 != 0) && (iVar2 = Gia_ObjRefNum((Gia_Man_t *)pObj,pFan0), iVar2 < 1)) {
      __assert_fail("Gia_ObjRefNum(p, pObj) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                    ,0x16f,"void Emb_ManCreateRefsSpecial(Gia_Man_t *)");
    }
    local_44 = local_44 + 1;
  }
  Gia_ManCleanMark0((Gia_Man_t *)pObj);
  return;
}

Assistant:

void Emb_ManCreateRefsSpecial( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj, * pFan0, * pFan1;
    Gia_Obj_t * pObjC, * pObjD0, * pObjD1;
    int i;
    assert( p->pRefs == NULL );
    Gia_ManCleanMark0( p );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( pObj->fMark0 == 0 );
        pFan0 = Gia_ObjFanin0(pObj);
        pFan1 = Gia_ObjFanin1(pObj);
        // skip nodes whose fanins are PIs or are already marked
        if ( Gia_ObjIsCi(pFan0) || pFan0->fMark0 || 
             Gia_ObjIsCi(pFan1) || pFan1->fMark0 )
             continue;
        // skip nodes that are not MUX type
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        // the node is MUX type, mark it and its fanins
        pObj->fMark0  = 1;
        pFan0->fMark0 = 1;
        pFan1->fMark0 = 1;
        // deref the control 
        pObjC = Gia_ObjRecognizeMux( pObj, &pObjD1, &pObjD0 );
        Gia_ObjRefDec( p, Gia_Regular(pObjC) );
        if ( Gia_Regular(pObjD0) == Gia_Regular(pObjD1) )
            Gia_ObjRefDec( p, Gia_Regular(pObjD0) );
    }
    Gia_ManForEachAnd( p, pObj, i )
        assert( Gia_ObjRefNum(p, pObj) > 0 );
    Gia_ManCleanMark0( p );
}